

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmTargetCollectLinkLanguages::Visit(cmTargetCollectLinkLanguages *this,cmLinkItem *item)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  long lVar3;
  cmLocalGenerator *pcVar4;
  ostream *poVar5;
  string *psVar6;
  cmake *this_01;
  reference __x;
  reference item_00;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar8;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_260;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_258;
  const_iterator li_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  const_iterator li;
  cmLinkInterface *iface;
  cmListFileBacktrace local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_198 [8];
  ostringstream e;
  MessageType local_20;
  MessageType messageType;
  bool noMessage;
  cmLinkItem *item_local;
  cmTargetCollectLinkLanguages *this_local;
  
  if (item->Target == (cmGeneratorTarget *)0x0) {
    lVar3 = std::__cxx11::string::find((char *)item,0xa2014a);
    if (lVar3 != -1) {
      bVar1 = false;
      local_20 = FATAL_ERROR;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
      PVar2 = cmLocalGenerator::GetPolicyStatus(pcVar4,CMP0028);
      if (PVar2 == OLD) {
        bVar1 = true;
      }
      else if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x1c,id);
        poVar5 = std::operator<<((ostream *)local_198,(string *)&local_1c8);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&local_1c8);
        local_20 = AUTHOR_WARNING;
      }
      if (!bVar1) {
        poVar5 = std::operator<<((ostream *)local_198,"Target \"");
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"\" links to target \"");
        poVar5 = std::operator<<(poVar5,(string *)item);
        std::operator<<(poVar5,
                        "\" but the target was not found.  Perhaps a find_package() call is missing for an IMPORTED target, or an ALIAS target is missing?"
                       );
        pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
        this_01 = cmLocalGenerator::GetCMakeInstance(pcVar4);
        std::__cxx11::ostringstream::str();
        cmGeneratorTarget::GetBacktrace(&local_208,this->Target);
        cmake::IssueMessage(this_01,local_20,&local_1e8,&local_208);
        cmListFileBacktrace::~cmListFileBacktrace(&local_208);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    }
  }
  else {
    pVar7 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(&this->Visited,&item->Target);
    if ((((pVar7.second ^ 0xffU) & 1) == 0) &&
       (li._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmGeneratorTarget::GetLinkInterface(item->Target,&this->Config,this->HeadTarget),
       (cmLinkInterface *)li._M_current != (cmLinkInterface *)0x0)) {
      local_238._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&((cmLinkInterface *)li._M_current)->Languages);
      while( true ) {
        local_240._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&(li._M_current)->field_2 + 8));
        bVar1 = __gnu_cxx::operator!=(&local_238,&local_240);
        if (!bVar1) break;
        this_00 = this->Languages;
        __x = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_238);
        pVar8 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(this_00,__x);
        li_1._M_current =
             (cmLinkItem *)
             pVar8.first.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_238);
      }
      local_258._M_current =
           (cmLinkItem *)
           std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                     ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)li._M_current);
      while( true ) {
        local_260._M_current =
             (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                       ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)li._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_258,&local_260);
        if (!bVar1) break;
        item_00 = __gnu_cxx::
                  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                  ::operator*(&local_258);
        Visit(this,item_00);
        __gnu_cxx::
        __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
        ::operator++(&local_258);
      }
    }
  }
  return;
}

Assistant:

void Visit(cmLinkItem const& item)
  {
    if (!item.Target) {
      if (item.find("::") != std::string::npos) {
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        std::ostringstream e;
        switch (this->Target->GetLocalGenerator()->GetPolicyStatus(
          cmPolicies::CMP0028)) {
          case cmPolicies::WARN: {
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0028) << "\n";
            messageType = cmake::AUTHOR_WARNING;
          } break;
          case cmPolicies::OLD:
            noMessage = true;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            // Issue the fatal message.
            break;
        }

        if (!noMessage) {
          e << "Target \"" << this->Target->GetName()
            << "\" links to target \"" << item
            << "\" but the target was not found.  Perhaps a find_package() "
               "call is missing for an IMPORTED target, or an ALIAS target is "
               "missing?";
          this->Target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
            messageType, e.str(), this->Target->GetBacktrace());
        }
      }
      return;
    }
    if (!this->Visited.insert(item.Target).second) {
      return;
    }
    cmLinkInterface const* iface =
      item.Target->GetLinkInterface(this->Config, this->HeadTarget);
    if (!iface) {
      return;
    }

    for (std::vector<std::string>::const_iterator li =
           iface->Languages.begin();
         li != iface->Languages.end(); ++li) {
      this->Languages.insert(*li);
    }

    for (std::vector<cmLinkItem>::const_iterator li = iface->Libraries.begin();
         li != iface->Libraries.end(); ++li) {
      this->Visit(*li);
    }
  }